

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare::operator()
          (SymbolCompare *this,SymbolEntry *lhs,SymbolEntry *rhs)

{
  DescriptorIndex *index;
  pointer pEVar1;
  uint uVar2;
  String *pSVar3;
  String *pSVar4;
  ulong uVar5;
  size_type sVar6;
  difference_type __diff;
  size_type sVar7;
  size_type sVar8;
  size_type sVar9;
  pointer local_90;
  pointer local_88;
  string local_70;
  string local_50;
  
  index = this->index;
  pEVar1 = (index->all_values_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar6 = pEVar1[lhs->data_offset].encoded_package._M_string_length;
  if (sVar6 == 0) {
    pSVar3 = &lhs->encoded_symbol;
    sVar6 = (lhs->encoded_symbol)._M_string_length;
    local_88 = (pointer)0x0;
    sVar7 = 0;
  }
  else {
    pSVar3 = &pEVar1[lhs->data_offset].encoded_package;
    local_88 = (lhs->encoded_symbol)._M_dataplus._M_p;
    sVar7 = (lhs->encoded_symbol)._M_string_length;
  }
  sVar9 = pEVar1[rhs->data_offset].encoded_package._M_string_length;
  if (sVar9 == 0) {
    pSVar4 = &rhs->encoded_symbol;
    sVar9 = (rhs->encoded_symbol)._M_string_length;
    local_90 = (pointer)0x0;
    sVar8 = 0;
  }
  else {
    pSVar4 = &pEVar1[rhs->data_offset].encoded_package;
    local_90 = (rhs->encoded_symbol)._M_dataplus._M_p;
    sVar8 = (rhs->encoded_symbol)._M_string_length;
  }
  uVar5 = sVar9;
  if (sVar6 < sVar9) {
    uVar5 = sVar6;
  }
  if (uVar5 != 0) {
    uVar2 = memcmp((pSVar3->_M_dataplus)._M_p,(pSVar4->_M_dataplus)._M_p,uVar5);
    if (uVar2 == 0) goto LAB_0022eb26;
LAB_0022eb58:
    uVar5 = (ulong)uVar2;
    goto LAB_0022ec2b;
  }
LAB_0022eb26:
  if (sVar6 == sVar9) {
    uVar5 = sVar8;
    if (sVar7 < sVar8) {
      uVar5 = sVar7;
    }
    if (uVar5 != 0) {
      uVar2 = memcmp(local_88,local_90,uVar5);
      if (uVar2 != 0) goto LAB_0022eb58;
    }
    uVar5 = 0xffffffff80000000;
    if (-0x80000000 < (long)(sVar7 - sVar8)) {
      uVar5 = sVar7 - sVar8;
    }
    if (0x7ffffffe < (long)uVar5) {
      uVar5 = 0;
    }
    goto LAB_0022ec2b;
  }
  SymbolEntry::AsString_abi_cxx11_(&local_70,lhs,index);
  SymbolEntry::AsString_abi_cxx11_(&local_50,rhs,this->index);
  sVar6 = local_70._M_string_length;
  if (local_50._M_string_length < local_70._M_string_length) {
    sVar6 = local_50._M_string_length;
  }
  if (sVar6 == 0) {
LAB_0022ebb5:
    uVar5 = 0xffffffff80000000;
    if (-0x80000000 < (long)(local_70._M_string_length - local_50._M_string_length)) {
      uVar5 = local_70._M_string_length - local_50._M_string_length;
    }
    if (0x7ffffffe < (long)uVar5) {
      uVar5 = 0;
    }
  }
  else {
    uVar2 = memcmp(local_70._M_dataplus._M_p,local_50._M_dataplus._M_p,sVar6);
    uVar5 = (ulong)uVar2;
    if (uVar2 == 0) goto LAB_0022ebb5;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
LAB_0022ec2b:
  return (bool)((byte)(uVar5 >> 0x1f) & 1);
}

Assistant:

bool operator()(const SymbolEntry& lhs, const SymbolEntry& rhs) const {
      auto lhs_parts = GetParts(lhs);
      auto rhs_parts = GetParts(rhs);

      // Fast path to avoid making the whole string for common cases.
      if (int res =
              lhs_parts.first.substr(0, rhs_parts.first.size())
                  .compare(rhs_parts.first.substr(0, lhs_parts.first.size()))) {
        // If the packages already differ, exit early.
        return res < 0;
      } else if (lhs_parts.first.size() == rhs_parts.first.size()) {
        return lhs_parts.second < rhs_parts.second;
      }
      return AsString(lhs) < AsString(rhs);
    }